

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformAction<bool(unsigned_long,unsigned_long,pstore::file::file_base::lock_kind,pstore::file::file_base::blocking_mode)>
          (Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<bool> *pAVar2;
  ArgumentTuple local_30;
  
  pAVar2 = (ActionResultHolder<bool> *)operator_new(0x10);
  local_30.
  super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .
  super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .
  super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .super__Tuple_impl<3UL,_pstore::file::file_base::blocking_mode>.
  super__Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>._M_head_impl =
       (_Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>)
       (args->
       super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       ).
       super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       .
       super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       .super__Tuple_impl<3UL,_pstore::file::file_base::blocking_mode>.
       super__Head_base<3UL,_pstore::file::file_base::blocking_mode,_false>._M_head_impl;
  local_30.
  super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .
  super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .
  super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .super__Head_base<2UL,_pstore::file::file_base::lock_kind,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       ).
       super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       .
       super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       .super__Head_base<2UL,_pstore::file::file_base::lock_kind,_false>._M_head_impl;
  local_30.
  super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .
  super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       ).
       super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
  local_30.
  super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (args->
       super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
       ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  RVar1 = Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
          ::Perform(action,&local_30);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_001e51e8;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }